

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

PatchList duckdb_re2::PatchList::Append(Inst *inst0,PatchList l1,PatchList l2)

{
  ulong uVar1;
  uint32_t uVar2;
  PatchList PVar3;
  PatchList PVar4;
  
  PVar3 = l2;
  PVar4 = l2;
  if ((l1.head != 0) && (uVar2 = l2.head, PVar3 = l1, PVar4 = l1, uVar2 != 0)) {
    uVar1 = (ulong)l1 >> 0x21;
    if (((ulong)l1 >> 0x20 & 1) == 0) {
      inst0[uVar1].out_opcode_ = inst0[uVar1].out_opcode_ & 0xf | uVar2 << 4;
      PVar3 = l2;
    }
    else {
      inst0[uVar1].field_1.out1_ = uVar2;
      PVar3 = l2;
    }
  }
  return (PatchList)((ulong)PVar4 & 0xffffffff | (ulong)PVar3 & 0xffffffff00000000);
}

Assistant:

static PatchList Append(Prog::Inst* inst0, PatchList l1, PatchList l2) {
    if (l1.head == 0)
      return l2;
    if (l2.head == 0)
      return l1;
    Prog::Inst* ip = &inst0[l1.tail>>1];
    if (l1.tail&1)
      ip->out1_ = l2.head;
    else
      ip->set_out(l2.head);
    return {l1.head, l2.tail};
  }